

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSingle.c
# Opt level: O0

void Fxu_MatrixComputeSingles(Fxu_Matrix *p,int fUse0,int nSingleMax)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  void *pvVar3;
  Fxu_Var *pVar1;
  Fxu_Var *pVar2;
  int local_48;
  int local_44;
  int c;
  int i_1;
  int Weight;
  int nDivCount;
  int *pWeigtCounts;
  int k;
  int i;
  Vec_Ptr_t *vSingles;
  Fxu_Var *pVar;
  int nSingleMax_local;
  int fUse0_local;
  Fxu_Matrix *p_local;
  
  p->nWeightLimit = 1 - fUse0;
  p_00 = Vec_PtrAlloc(10000);
  for (vSingles = (Vec_Ptr_t *)(p->lVars).pHead; vSingles != (Vec_Ptr_t *)0x0;
      vSingles = (Vec_Ptr_t *)vSingles[3].pArray) {
    Fxu_MatrixComputeSinglesOneCollect(p,(Fxu_Var *)vSingles,p_00);
  }
  iVar1 = Vec_PtrSize(p_00);
  p->nSingleTotal = iVar1 / 3;
  iVar1 = Vec_PtrSize(p_00);
  if (nSingleMax < iVar1) {
    iVar1 = Vec_PtrSize(p_00);
    if (iVar1 % 3 != 0) {
      __assert_fail("Vec_PtrSize(vSingles) % 3 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSingle.c"
                    ,0x3f,"void Fxu_MatrixComputeSingles(Fxu_Matrix *, int, int)");
    }
    pvVar2 = malloc(4000);
    memset(pvVar2,0,4000);
    for (local_44 = 2; iVar1 = Vec_PtrSize(p_00), local_44 < iVar1; local_44 = local_44 + 3) {
      pvVar3 = Vec_PtrEntry(p_00,local_44);
      iVar1 = (int)pvVar3;
      if (iVar1 < 999) {
        *(int *)((long)pvVar2 + (long)iVar1 * 4) = *(int *)((long)pvVar2 + (long)iVar1 * 4) + 1;
      }
      else {
        *(int *)((long)pvVar2 + 0xf9c) = *(int *)((long)pvVar2 + 0xf9c) + 1;
      }
    }
    i_1 = 0;
    local_48 = 999;
    while ((-1 < local_48 &&
           (i_1 = *(int *)((long)pvVar2 + (long)local_48 * 4) + i_1, i_1 < nSingleMax))) {
      local_48 = local_48 + -1;
    }
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
    }
    pWeigtCounts._0_4_ = 0;
    for (local_44 = 2; iVar1 = Vec_PtrSize(p_00), local_44 < iVar1; local_44 = local_44 + 3) {
      pvVar2 = Vec_PtrEntry(p_00,local_44);
      if (local_48 <= (int)pvVar2) {
        pvVar2 = Vec_PtrEntry(p_00,local_44 + -2);
        Vec_PtrWriteEntry(p_00,(int)pWeigtCounts,pvVar2);
        iVar1 = (int)pWeigtCounts + 2;
        pvVar2 = Vec_PtrEntry(p_00,local_44 + -1);
        Vec_PtrWriteEntry(p_00,(int)pWeigtCounts + 1,pvVar2);
        pWeigtCounts._0_4_ = (int)pWeigtCounts + 3;
        pvVar2 = Vec_PtrEntry(p_00,local_44);
        Vec_PtrWriteEntry(p_00,iVar1,pvVar2);
        if ((int)pWeigtCounts / 3 == nSingleMax) break;
      }
    }
    Vec_PtrShrink(p_00,(int)pWeigtCounts);
    p->nWeightLimit = local_48;
  }
  iVar1 = Vec_PtrSize(p_00);
  if (iVar1 % 3 != 0) {
    __assert_fail("Vec_PtrSize(vSingles) % 3 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSingle.c"
                  ,0x66,"void Fxu_MatrixComputeSingles(Fxu_Matrix *, int, int)");
  }
  for (pWeigtCounts._4_4_ = 0; iVar1 = Vec_PtrSize(p_00), pWeigtCounts._4_4_ < iVar1;
      pWeigtCounts._4_4_ = pWeigtCounts._4_4_ + 3) {
    pVar1 = (Fxu_Var *)Vec_PtrEntry(p_00,pWeigtCounts._4_4_);
    pVar2 = (Fxu_Var *)Vec_PtrEntry(p_00,pWeigtCounts._4_4_ + 1);
    pvVar2 = Vec_PtrEntry(p_00,pWeigtCounts._4_4_ + 2);
    Fxu_MatrixAddSingle(p,pVar1,pVar2,(int)pvVar2);
  }
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Fxu_MatrixComputeSingles( Fxu_Matrix * p, int fUse0, int nSingleMax )
{
    Fxu_Var * pVar;
    Vec_Ptr_t * vSingles;
    int i, k;
    // set the weight limit
    p->nWeightLimit = 1 - fUse0;
    // iterate through columns in the matrix and collect single-cube divisors
    vSingles = Vec_PtrAlloc( 10000 );
    Fxu_MatrixForEachVariable( p, pVar )
        Fxu_MatrixComputeSinglesOneCollect( p, pVar, vSingles );
    p->nSingleTotal = Vec_PtrSize(vSingles) / 3;
    // check if divisors should be filtered
    if ( Vec_PtrSize(vSingles) > nSingleMax )
    {
        int * pWeigtCounts, nDivCount, Weight, i, c;;
        assert( Vec_PtrSize(vSingles) % 3 == 0 );
        // count how many divisors have the given weight
        pWeigtCounts = ABC_ALLOC( int, 1000 );
        memset( pWeigtCounts, 0, sizeof(int) * 1000 );
        for ( i = 2; i < Vec_PtrSize(vSingles); i += 3 )
        {
            Weight = (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles, i);
            if ( Weight >= 999 )
                pWeigtCounts[999]++;
            else
                pWeigtCounts[Weight]++;
        }
        // select the bound on the weight (above this bound, singles will be included)
        nDivCount = 0;
        for ( c = 999; c >= 0; c-- )
        {
            nDivCount += pWeigtCounts[c];
            if ( nDivCount >= nSingleMax )
                break;
        }
        ABC_FREE( pWeigtCounts );
        // collect singles with the given costs
        k = 0;
        for ( i = 2; i < Vec_PtrSize(vSingles); i += 3 )
        {
            Weight = (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles, i);
            if ( Weight < c )
                continue;
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i-2) );
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i-1) );
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i) );
            if ( k/3 == nSingleMax )
                break;
        }
        Vec_PtrShrink( vSingles, k );
        // adjust the weight limit
        p->nWeightLimit = c;
    }
    // collect the selected divisors
    assert( Vec_PtrSize(vSingles) % 3 == 0 );
    for ( i = 0; i < Vec_PtrSize(vSingles); i += 3 )
    {
        Fxu_MatrixAddSingle( p, 
            (Fxu_Var *)Vec_PtrEntry(vSingles,i), 
            (Fxu_Var *)Vec_PtrEntry(vSingles,i+1), 
            (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles,i+2) );
    }
    Vec_PtrFree( vSingles );
}